

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPReductionClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPReductionClause *this)

{
  OpenMPReductionClauseIdentifier OVar1;
  pointer pcVar2;
  string clause_string;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"reduction ","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"(","");
  OVar1 = this->identifier;
  if (this->modifier < OMPC_REDUCTION_MODIFIER_unknown) {
    std::__cxx11::string::append((char *)&local_70);
  }
  if (1 < local_68) {
    std::__cxx11::string::append((char *)&local_70);
  }
  switch(OVar1) {
  case OMPC_REDUCTION_IDENTIFIER_plus:
    break;
  case OMPC_REDUCTION_IDENTIFIER_minus:
    break;
  case OMPC_REDUCTION_IDENTIFIER_mul:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitand:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitor:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitxor:
    break;
  case OMPC_REDUCTION_IDENTIFIER_logand:
    break;
  case OMPC_REDUCTION_IDENTIFIER_logor:
    break;
  default:
    goto switchD_0017ad7a_caseD_8;
  case OMPC_REDUCTION_IDENTIFIER_max:
    break;
  case OMPC_REDUCTION_IDENTIFIER_min:
    break;
  case OMPC_REDUCTION_IDENTIFIER_user:
    pcVar2 = (this->user_defined_identifier)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (this->user_defined_identifier)._M_string_length)
    ;
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    goto switchD_0017ad7a_caseD_8;
  }
  std::__cxx11::string::append((char *)&local_70);
switchD_0017ad7a_caseD_8:
  if (1 < local_68) {
    std::__cxx11::string::append((char *)&local_70);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_50,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_70);
  if (3 < local_68) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPReductionClause::toString() {

    std::string result = "reduction ";
    std::string clause_string = "(";
    OpenMPReductionClauseModifier modifier = this->getModifier();
    OpenMPReductionClauseIdentifier identifier = this->getIdentifier();
    switch (modifier) {
        case OMPC_REDUCTION_MODIFIER_default:
            clause_string += "default";
            break;
        case OMPC_REDUCTION_MODIFIER_inscan:
            clause_string += "inscan";
            break;
        case OMPC_REDUCTION_MODIFIER_task:
            clause_string += "task";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += ", ";
    };
    switch (identifier) {
        case OMPC_REDUCTION_IDENTIFIER_plus:
            clause_string += "+";
            break;
        case OMPC_REDUCTION_IDENTIFIER_minus:
            clause_string += "-";
            break;
        case OMPC_REDUCTION_IDENTIFIER_mul:
            clause_string += "*";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitand:
            clause_string += "&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitor:
            clause_string += "|";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitxor:
            clause_string += "^";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logand:
            clause_string += "&&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logor:
            clause_string += "||";
            break;
        case OMPC_REDUCTION_IDENTIFIER_min:
            clause_string += "min";
            break;
        case OMPC_REDUCTION_IDENTIFIER_max:
            clause_string += "max";
            break;
        case OMPC_REDUCTION_IDENTIFIER_user:
            clause_string += this->getUserDefinedIdentifier();
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}